

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::Clara::Args::Args
          (Args *this,
          initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  allocator_type local_19;
  
  __str = args._M_array;
  std::__cxx11::string::string((string *)this,__str);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<std::__cxx11::string_const*,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->m_args,
             __str + 1,__str + args._M_len,&local_19);
  return;
}

Assistant:

Args::Args(std::initializer_list<std::string> args) :
            m_exeName(*args.begin()),
            m_args(args.begin() + 1, args.end()) {}